

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool ctemplate::Template::IsBlankOrOnlyHasOneRemovableMarker
               (char **line,size_t *len,MarkerDelimiters *delim)

{
  int iVar1;
  char *pcVar2;
  char *found_end_marker;
  size_t new_len;
  char *clean_line;
  MarkerDelimiters *delim_local;
  size_t *len_local;
  char **line_local;
  
  new_len = (size_t)*line;
  found_end_marker = (char *)*len;
  clean_line = (char *)delim;
  delim_local = (MarkerDelimiters *)len;
  len_local = (size_t *)line;
  StripTemplateWhiteSpace((char **)&new_len,(size_t *)&found_end_marker);
  if (found_end_marker == (char *)0x0) {
    *len_local = new_len;
    delim_local->start_marker = (char *)0x0;
    line_local._7_1_ = true;
  }
  else if (found_end_marker <
           (char *)(*(long *)(clean_line + 8) + *(long *)(clean_line + 0x18) + 1U)) {
    line_local._7_1_ = false;
  }
  else {
    iVar1 = memcmp((void *)new_len,*(void **)clean_line,*(size_t *)(clean_line + 8));
    if ((iVar1 == 0) &&
       (pcVar2 = strchr("#/>!%=",(int)*(char *)(new_len + *(long *)(clean_line + 8))),
       pcVar2 != (char *)0x0)) {
      pcVar2 = anon_unknown_14::memmatch
                         ((char *)(new_len + *(long *)(clean_line + 8)),
                          (long)found_end_marker - *(long *)(clean_line + 8),
                          *(char **)(clean_line + 0x10),*(size_t *)(clean_line + 0x18));
      if ((pcVar2 != (char *)0x0) &&
         (pcVar2 + *(long *)(clean_line + 0x18) == found_end_marker + new_len)) {
        *len_local = new_len;
        delim_local->start_marker = found_end_marker;
        return true;
      }
      return false;
    }
    line_local._7_1_ = false;
  }
  return line_local._7_1_;
}

Assistant:

bool Template::IsBlankOrOnlyHasOneRemovableMarker(
    const char** line, size_t* len, const Template::MarkerDelimiters& delim) {
  const char *clean_line = *line;
  size_t new_len = *len;
  StripTemplateWhiteSpace(&clean_line, &new_len);

  // If there was only white space on the line, new_len will now be zero.
  // In that case the line should be removed, so return true.
  if (new_len == 0) {
    *line = clean_line;
    *len = new_len;
    return true;
  }

  // The smallest removable marker is at least start_marker_len +
  // end_marker_len + 1 characters long.  If there aren't enough
  // characters, then keep the line by returning false.
  if (new_len < delim.start_marker_len + delim.end_marker_len + 1) {
    return false;
  }

  // Only {{#...}}, {{/....}, {{>...}, {{!...}, {{%...}} and {{=...=}}
  // are "removable"
  if (memcmp(clean_line, delim.start_marker, delim.start_marker_len) != 0 ||
      !strchr("#/>!%=", clean_line[delim.start_marker_len])) {
    return false;
  }

  const char *found_end_marker = memmatch(clean_line + delim.start_marker_len,
                                          new_len - delim.start_marker_len,
                                          delim.end_marker,
                                          delim.end_marker_len);

  // Make sure the end marker comes at the end of the line.
  if (!found_end_marker ||
      found_end_marker + delim.end_marker_len != clean_line + new_len) {
    return false;
  }

  // else return the line stripped of its white space chars so when the
  // marker is removed in expansion, no white space is left from the line
  // that has now been removed
  *line = clean_line;
  *len = new_len;
  return true;
}